

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_d3d56.cc
# Opt level: O0

bool __thiscall hwtest::pgraph::MthdD3D6StencilFunc::is_valid_val(MthdD3D6StencilFunc *this)

{
  MthdD3D6StencilFunc *this_local;
  
  if (((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x3c) >> 0x3d == 0) {
    if ((((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x38) >> 0x3c == 0) ||
       (8 < ((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x38) >> 0x3c)) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool is_valid_val() override {
		if (extr(val, 1, 3))
			return false;
		if (extr(val, 4, 4) < 1 || extr(val, 4, 4) > 8)
			return false;
		return true;
	}